

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O2

IndexRange __thiscall
iDynTree::BerdyHelper::getRangeLinkSensorVariable
          (BerdyHelper *this,BerdySensorTypes sensorType,LinkIndex idx)

{
  size_t sVar1;
  long lVar2;
  IndexRange IVar3;
  
  lVar2 = iDynTree::IndexRange::InvalidRange();
  if (sensorType == NET_EXT_WRENCH_SENSOR) {
    if ((this->m_options).berdyVariant == ORIGINAL_BERDY_FIXED_BASE) {
      lVar2 = iDynTree::Traversal::getTraversalIndexFromLinkIndex((long)&this->m_dynamicsTraversal);
      sVar1 = (this->berdySensorTypeOffsets).netExtWrenchOffset;
      if ((this->m_options).includeFixedBaseExternalWrench == true) {
        lVar2 = sVar1 + lVar2 * 6;
      }
      else {
        lVar2 = sVar1 + lVar2 * 6 + -6;
      }
    }
    else {
      lVar2 = idx * 6 + (this->berdySensorTypeOffsets).netExtWrenchOffset;
    }
  }
  IVar3.size = 6;
  IVar3.offset = lVar2;
  return IVar3;
}

Assistant:

IndexRange BerdyHelper::getRangeLinkSensorVariable(const BerdySensorTypes sensorType, const LinkIndex idx) const
{
    IndexRange ret = IndexRange::InvalidRange();
    ret.size = 6;

    if( sensorType == NET_EXT_WRENCH_SENSOR )
    {
        ret.size = 6;

        if (m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE)
        {
            TraversalIndex trvIdx = m_dynamicsTraversal.getTraversalIndexFromLinkIndex(idx);

            if (m_options.includeFixedBaseExternalWrench)
            {
                ret.offset = berdySensorTypeOffsets.netExtWrenchOffset + 6*trvIdx;
            }
            else
            {
                ret.offset = berdySensorTypeOffsets.netExtWrenchOffset + 6*(trvIdx-1);
            }
        }
        else
        {
            ret.offset = berdySensorTypeOffsets.netExtWrenchOffset + 6*idx;
        }
    }

    assert(ret.isValid());
    return ret;
}